

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O2

PaError PaAlsa_StrDup(PaAlsaHostApiRepresentation *alsaApi,char **dst,char *src)

{
  PaError PVar1;
  size_t sVar2;
  char *__dest;
  
  sVar2 = strlen(src);
  sVar2 = (size_t)((int)sVar2 + 1);
  __dest = (char *)PaUtil_GroupAllocateMemory(alsaApi->allocations,sVar2);
  *dst = __dest;
  if (__dest == (char *)0x0) {
    PaUtil_DebugPrint(
                     "Expression \'*dst = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len )\' failed in \'/workspace/llm4binary/github/license_c_cmakelists/rosmarinus[P]jtalkdll/portaudio/src/hostapi/alsa/pa_linux_alsa.c\', line: 1055\n"
                     );
    PVar1 = -0x2708;
  }
  else {
    strncpy(__dest,src,sVar2);
    PVar1 = 0;
  }
  return PVar1;
}

Assistant:

static PaError PaAlsa_StrDup( PaAlsaHostApiRepresentation *alsaApi,
        char **dst,
        const char *src)
{
    PaError result = paNoError;
    int len = strlen( src ) + 1;

    /* PA_DEBUG(("PaStrDup %s %d\n", src, len)); */

    PA_UNLESS( *dst = (char *)PaUtil_GroupAllocateMemory( alsaApi->allocations, len ),
            paInsufficientMemory );
    strncpy( *dst, src, len );

error:
    return result;
}